

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::Coap::ReceiveMessage
          (Coap *this,Endpoint *aEndpoint,shared_ptr<ot::commissioner::coap::Message> *aMessage,
          Error *error)

{
  bool bVar1;
  element_type *peVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_14a;
  v10 local_149;
  bool condition;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_148;
  char *local_140;
  string local_138;
  allocator local_101;
  string local_100;
  ErrorCode local_dc;
  Error *local_d8;
  Error *error_local;
  shared_ptr<ot::commissioner::coap::Message> *aMessage_local;
  Endpoint *aEndpoint_local;
  Coap *this_local;
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  char *local_88;
  string *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  undefined1 *local_58;
  Coap **local_50;
  undefined1 *local_48;
  Coap **local_40;
  Coap **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  char *pcStack_10;
  
  local_dc = kNone;
  local_d8 = error;
  error_local = (Error *)aMessage;
  aMessage_local = (shared_ptr<ot::commissioner::coap::Message> *)aEndpoint;
  aEndpoint_local = (Endpoint *)this;
  bVar1 = commissioner::operator!=(error,&local_dc);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"coap",&local_101);
    ReceiveMessage::anon_class_1_0_00000001::operator()(&local_14a);
    local_58 = (undefined1 *)&stack0xfffffffffffffeb8;
    local_60 = &local_149;
    bVar3 = ::fmt::v10::operator()(local_60);
    local_140 = (char *)bVar3.size_;
    pbStack_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar3.data_;
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    local_80 = Error::GetMessage_abi_cxx11_(error);
    local_68 = &local_138;
    local_78 = pbStack_148;
    pcStack_70 = local_140;
    local_20 = &local_78;
    local_90 = pbStack_148;
    local_88 = local_140;
    local_18 = local_90;
    pcStack_10 = local_88;
    this_local = (Coap *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                   ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_80,(v10 *)local_68,pbStack_148);
    local_48 = local_a0;
    local_50 = &this_local;
    local_30 = 0xd;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_50;
    fmt.size_ = 0xd;
    fmt.data_ = local_88;
    local_40 = local_50;
    local_38 = local_50;
    local_28 = local_48;
    ::fmt::v10::vformat_abi_cxx11_(&local_138,(v10 *)local_90,fmt,args);
    Log(kInfo,&local_100,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  else {
    bVar1 = std::operator!=(aMessage,(nullptr_t)0x0);
    if (!bVar1) {
      __assert_fail("condition",
                    "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.cpp"
                    ,0x277,
                    "void ot::commissioner::coap::Coap::ReceiveMessage(Endpoint &, std::shared_ptr<Message>, Error)"
                   );
    }
    peVar2 = std::
             __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)aMessage);
    Message::SetEndpoint(peVar2,(Endpoint *)aMessage_local);
    peVar2 = std::
             __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)aMessage);
    bVar1 = Message::IsRequest(peVar2);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)aMessage);
      HandleRequest(this,peVar2);
    }
    else {
      peVar2 = std::
               __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)aMessage);
      HandleResponse(this,peVar2);
    }
  }
  return;
}

Assistant:

void Coap::ReceiveMessage(Endpoint &aEndpoint, std::shared_ptr<Message> aMessage, Error error)
{
    if (error != ErrorCode::kNone)
    {
        // Silently drop a bad formatted message
        LOG_INFO(LOG_REGION_COAP, "drop a CoAP message in bad format: {}", error.GetMessage());
    }
    else
    {
        ASSERT(aMessage != nullptr);

        aMessage->SetEndpoint(&aEndpoint);
        if (aMessage->IsRequest())
        {
            HandleRequest(*aMessage);
        }
        else
        {
            HandleResponse(*aMessage);
        }
    }
}